

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGV.cpp
# Opt level: O2

void __thiscall CGV::visit(CGV *this,FuncDef *node)

{
  SymbolTable *this_00;
  CodeWriter *pCVar1;
  bool bVar2;
  ASTNode *pAVar3;
  ASTNode *this_01;
  string *psVar4;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar5;
  Function *pFVar6;
  _Elt_pointer ppAVar7;
  string local_e0;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  string local_b8;
  string local_98;
  string local_78;
  string funcName;
  string returnType;
  
  pAVar3 = AST::ASTNode::getChild(&node->super_ASTNode,0);
  this_01 = AST::ASTNode::getChild(pAVar3,0);
  psVar4 = AST::ASTNode::getName_abi_cxx11_(this_01);
  std::__cxx11::string::string((string *)&funcName,(string *)psVar4);
  pdVar5 = AST::ASTNode::getChildren(pAVar3);
  ppAVar7 = (pdVar5->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar7 ==
      (pdVar5->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar7 = (pdVar5->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
              super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  psVar4 = AST::ASTNode::getName_abi_cxx11_(ppAVar7[-1]);
  std::__cxx11::string::string((string *)&returnType,(string *)psVar4);
  this_00 = this->symbolTable;
  pFVar6 = STGV::createTempFunction(&node->super_ASTNode,&funcName,&returnType,(Detector *)0x0);
  pFVar6 = Semantic::SymbolTable::getFreeFunction(this_00,&funcName,pFVar6);
  this->currentFunction = pFVar6;
  pCVar1 = this->writer;
  psVar4 = Function::getTag_abi_cxx11_(pFVar6);
  CodeWriter::tag(pCVar1,psVar4,false);
  pCVar1 = this->writer;
  std::__cxx11::string::string
            ((string *)&local_e0,"Saving values of reserved registers",(allocator *)&local_b8);
  CodeWriter::comment(pCVar1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  pCVar1 = this->writer;
  std::__cxx11::string::string((string *)&local_e0,"r12",(allocator *)&local_78);
  std::__cxx11::string::string((string *)&local_b8,"r15",(allocator *)&local_98);
  CodeWriter::saveWord(pCVar1,-4,&local_e0,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_e0);
  pCVar1 = this->writer;
  std::__cxx11::string::string((string *)&local_e0,"r12",(allocator *)&local_78);
  std::__cxx11::string::string((string *)&local_b8,"r14",(allocator *)&local_98);
  CodeWriter::saveWord(pCVar1,-8,&local_e0,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_e0);
  pCVar1 = this->writer;
  std::__cxx11::string::string((string *)&local_e0,"r12",(allocator *)&local_78);
  std::__cxx11::string::string((string *)&local_b8,"r12",(allocator *)&local_98);
  CodeWriter::saveWord(pCVar1,-0xc,&local_e0,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_e0);
  pCVar1 = this->writer;
  std::__cxx11::string::string
            ((string *)&local_e0,"Moving stack pointer to the same address as frame pointer",
             (allocator *)&local_b8);
  CodeWriter::comment(pCVar1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  pCVar1 = this->writer;
  std::__cxx11::string::string((string *)&local_e0,"subi",&local_b9);
  std::__cxx11::string::string((string *)&local_b8,"r14",&local_ba);
  std::__cxx11::string::string((string *)&local_78,"r12",&local_bb);
  std::__cxx11::to_string(&local_98,0xc);
  CodeWriter::OP(pCVar1,&local_e0,&local_b8,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_e0);
  pAVar3 = AST::ASTNode::getChild(&node->super_ASTNode,1);
  (**pAVar3->_vptr_ASTNode)(pAVar3,this);
  pCVar1 = this->writer;
  psVar4 = Function::getTag_abi_cxx11_(this->currentFunction);
  std::operator+(&local_e0,psVar4,"_end");
  CodeWriter::tag(pCVar1,&local_e0,false);
  std::__cxx11::string::~string((string *)&local_e0);
  pCVar1 = this->writer;
  std::__cxx11::string::string
            ((string *)&local_e0,
             "Moving stack pointer back to its position before function definition",
             (allocator *)&local_b8);
  CodeWriter::comment(pCVar1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  pCVar1 = this->writer;
  std::__cxx11::string::string((string *)&local_e0,"addi",&local_b9);
  std::__cxx11::string::string((string *)&local_b8,"r12",&local_ba);
  std::__cxx11::string::string((string *)&local_78,"r14",&local_bb);
  std::__cxx11::to_string(&local_98,0xc);
  CodeWriter::OP(pCVar1,&local_e0,&local_b8,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_e0);
  pCVar1 = this->writer;
  std::__cxx11::string::string
            ((string *)&local_e0,
             "setting values of reserved registers to their old values before function definition",
             (allocator *)&local_b8);
  CodeWriter::comment(pCVar1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  pCVar1 = this->writer;
  std::__cxx11::string::string((string *)&local_e0,"r15",(allocator *)&local_78);
  std::__cxx11::string::string((string *)&local_b8,"r12",(allocator *)&local_98);
  CodeWriter::loadWord(pCVar1,&local_e0,-4,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_e0);
  pCVar1 = this->writer;
  std::__cxx11::string::string((string *)&local_e0,"r14",(allocator *)&local_78);
  std::__cxx11::string::string((string *)&local_b8,"r12",(allocator *)&local_98);
  CodeWriter::loadWord(pCVar1,&local_e0,-8,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_e0);
  pCVar1 = this->writer;
  std::__cxx11::string::string((string *)&local_e0,"r12",(allocator *)&local_78);
  std::__cxx11::string::string((string *)&local_b8,"r12",(allocator *)&local_98);
  CodeWriter::loadWord(pCVar1,&local_e0,-0xc,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_e0);
  psVar4 = Function::getReturnType_abi_cxx11_(this->currentFunction);
  bVar2 = std::operator!=(psVar4,"void");
  if (bVar2) {
    pCVar1 = this->writer;
    std::__cxx11::string::string
              ((string *)&local_e0,"Loading return value to r1",(allocator *)&local_b8);
    CodeWriter::comment(pCVar1,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    pCVar1 = this->writer;
    std::__cxx11::string::string((string *)&local_e0,"r1",(allocator *)&local_78);
    std::__cxx11::string::string((string *)&local_b8,"r13",(allocator *)&local_98);
    CodeWriter::loadWord(pCVar1,&local_e0,-4,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_e0);
    pCVar1 = this->writer;
    std::__cxx11::string::string((string *)&local_e0,"r12",(allocator *)&local_78);
    std::__cxx11::string::string((string *)&local_b8,"r1",(allocator *)&local_98);
    CodeWriter::saveWord(pCVar1,-4,&local_e0,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  pCVar1 = this->writer;
  std::__cxx11::string::string((string *)&local_e0,"jr",(allocator *)&local_78);
  std::__cxx11::string::string((string *)&local_b8,"r15",(allocator *)&local_98);
  CodeWriter::OP(pCVar1,&local_e0,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&returnType);
  std::__cxx11::string::~string((string *)&funcName);
  return;
}

Assistant:

void CGV::visit(FuncDef *node) {
    auto signature = node->getChild(0);
    std::string funcName = signature->getChild(0)->getName();
    std::string returnType = signature->getChildren().back()->getName();
    currentFunction = symbolTable->getFreeFunction(funcName, STGV::createTempFunction(node, funcName, returnType, nullptr));
    writer->tag(currentFunction->getTag());
    writer->comment("Saving values of reserved registers");
    writer->saveWord(-4, "r12", "r15");
    writer->saveWord(-8, "r12", "r14");
    writer->saveWord(-12, "r12", "r12");
    writer->comment("Moving stack pointer to the same address as frame pointer");
    writer->OP("subi", "r14", "r12", std::to_string(12));
    //calling `funcBody` node
    node->getChild(1)->accept(*this);
    writer->tag(currentFunction->getTag() + "_end");
    writer->comment("Moving stack pointer back to its position before function definition");
    writer->OP("addi", "r12", "r14", std::to_string(12));
    writer->comment("setting values of reserved registers to their old values before function definition");
    writer->loadWord("r15", -4, "r12");
    writer->loadWord("r14", -8, "r12");
    writer->loadWord("r12", -12, "r12");
    if (currentFunction->getReturnType() != "void") {
        writer->comment("Loading return value to r1");
        writer->loadWord("r1", -4, "r13");
        writer->saveWord(-4, "r12", "r1");
    }
    writer->OP("jr", "r15");
}